

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void small_suite::test_minus_max(void)

{
  return_type rVar1;
  value_type input [1];
  decoder decoder;
  uchar local_61 [1];
  undefined4 local_60;
  value local_5c;
  decoder local_58;
  
  local_61[0] = 0xe0;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>(&local_58,&local_61);
  local_5c = local_58.current.code;
  local_60 = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x86,"void small_suite::test_minus_max()",&local_5c,&local_60);
  rVar1 = trial::protocol::bintoken::detail::decoder::
          overloader<trial::protocol::bintoken::token::int8>::decode(&local_58);
  local_60 = CONCAT31(local_60._1_3_,rVar1);
  local_5c = 0xffffffe0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,int>
            ("decoder.value<token::int8>()","-32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x87,"void small_suite::test_minus_max()",&local_60,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_5c = local_58.current.code;
  local_60 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x89,"void small_suite::test_minus_max()",&local_5c,&local_60);
  return;
}

Assistant:

void test_minus_max()
{
    const value_type input[] = { 0xE0 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int8>(), -32);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}